

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_SevenPairs_Test::testBody
          (TEST_DoublingFactorCounterTest_SevenPairs_Test *this)

{
  size_type sVar1;
  size_type sVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  char *pcVar5;
  unsigned_long in_stack_fffffffffffffe48;
  undefined4 uVar7;
  undefined8 uVar6;
  NormalTestTerminator *this_00;
  int value;
  NormalTestTerminator local_108;
  NormalTestTerminator local_100;
  SimpleString local_f8;
  SimpleString local_f0;
  NormalTestTerminator local_e8;
  NormalTestTerminator local_e0;
  key_type local_d4;
  SimpleString local_d0;
  SimpleString local_c8;
  key_type local_bc [6];
  key_type local_a4;
  undefined1 local_a0 [8];
  DoublingFactorReport r;
  TEST_DoublingFactorCounterTest_SevenPairs_Test *this_local;
  
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addPair
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,EastWind);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addPair
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,NorthWind);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addPair
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,ThreeOfCharacters);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addPair
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,NineOfCircles);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addPair
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,OneOfBamboos);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addPair
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,GreenDragon);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addPair
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,OneOfCharacters);
  r.doubling_factor._1_2_ = 0;
  r.doubling_factor._3_1_ = 0;
  r.bonus_tile_count._0_3_ = 0;
  mahjong::WiningState::winByDiscard
            (&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).s,
             (WinByDiscardSituation)0x0);
  mahjong::DoubligFactorCounter::report
            ((DoublingFactorReport *)local_a0,
             &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).c);
  local_a4 = SevenPairs;
  sVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,&local_a4);
  if (sVar1 == 1) {
    pUVar3 = UtestShell::getCurrent();
    local_e8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    this_00 = &local_e8;
    NormalTestTerminator::NormalTestTerminator(this_00);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x56);
    value = (int)((ulong)this_00 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x19c02c);
  }
  else {
    local_bc[1] = 0x1a;
    sVar1 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_bc + 1);
    local_bc[0] = SevenPairs;
    sVar2 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_bc);
    if (sVar1 != sVar2) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1b])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                 ,0x56);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)(in_stack_fffffffffffffe48 >> 0x20));
    pcVar4 = SimpleString::asCharString(&local_c8);
    local_d4 = SevenPairs;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *)
          &r.wining_hand.last_tile,&local_d4);
    StringFrom(in_stack_fffffffffffffe48);
    uVar7 = (undefined4)(in_stack_fffffffffffffe48 >> 0x20);
    pcVar5 = SimpleString::asCharString(&local_d0);
    local_e0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_e0);
    uVar6 = CONCAT44(uVar7,0x56);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,uVar6,&local_e0);
    value = (int)((ulong)uVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x19bf40);
    SimpleString::~SimpleString((SimpleString *)0x19bf4c);
    SimpleString::~SimpleString((SimpleString *)0x19bf58);
  }
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 2) {
    pUVar3 = UtestShell::getCurrent();
    local_108.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_108);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x57,&local_108);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x19c259);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_f0);
    StringFrom(value);
    pcVar5 = SimpleString::asCharString(&local_f8);
    local_100.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_100);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,CONCAT44(value,0x57),&local_100);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x19c16d);
    SimpleString::~SimpleString((SimpleString *)0x19c179);
    SimpleString::~SimpleString((SimpleString *)0x19c185);
  }
  mahjong::DoublingFactorReport::~DoublingFactorReport((DoublingFactorReport *)local_a0);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, SevenPairs)
{
	addPair(Tile::EastWind);
	addPair(Tile::NorthWind);
	addPair(Tile::ThreeOfCharacters);
	addPair(Tile::NineOfCircles);
	addPair(Tile::OneOfBamboos);
	addPair(Tile::GreenDragon);
	addPair(Tile::OneOfCharacters);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::SevenPairs));
	CHECK_EQUAL(2, r.doubling_factor);
}